

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdi::ControllerWidget::mouseMoveEvent(ControllerWidget *this,QMouseEvent *event)

{
  long lVar1;
  SubControl SVar2;
  QPointF *in_RSI;
  ControllerWidget *in_RDI;
  long in_FS_OFFSET;
  SubControl under_mouse;
  QWidget *in_stack_ffffffffffffffb8;
  ControllerWidget *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QSinglePointEvent::position((QSinglePointEvent *)0x62b8f4);
  QPointF::toPoint(in_RSI);
  SVar2 = getSubControl(this_00,(QPoint *)in_RSI);
  if (in_RDI->hoverControl != SVar2) {
    in_RDI->hoverControl = SVar2;
    QWidget::update(in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::mouseMoveEvent(QMouseEvent *event)
{
    QStyle::SubControl under_mouse = getSubControl(event->position().toPoint());
    //test if hover state changes
    if (hoverControl != under_mouse) {
        hoverControl = under_mouse;
        update();
    }
}